

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_MacProjector.cpp
# Opt level: O2

void __thiscall
Hydro::MacProjector::updateBeta
          (MacProjector *this,
          Vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
          *a_beta)

{
  pointer paVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this->m_linop == (MLLinOp *)0x0) {
    amrex::Assert_host("m_linop != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/Projections/hydro_MacProjector.cpp"
                       ,0x90,
                       "\"MacProjector::updateBeta: initProjector must be called before calling this method\""
                      );
  }
  if ((this->m_poisson)._M_t.
      super___uniq_ptr_impl<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MLPoisson_*,_std::default_delete<amrex::MLPoisson>_>.
      super__Head_base<0UL,_amrex::MLPoisson_*,_false>._M_head_impl != (MLPoisson *)0x0) {
    amrex::Assert_host("m_poisson == nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/Projections/hydro_MacProjector.cpp"
                       ,0x94,"\"MacProjector::updateBeta: should not be called for constant beta\"")
    ;
  }
  paVar1 = (a_beta->
           super_vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
           ).
           super__Vector_base<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(a_beta->
                 super_vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
                 ).
                 super__Vector_base<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1) / 0x18;
  bVar2 = amrex::FabArray<amrex::FArrayBox>::hasEBFabFactory
                    (&paVar1->_M_elems[0]->super_FabArray<amrex::FArrayBox>);
  uVar4 = 0;
  if (bVar2) {
    uVar5 = uVar3 & 0xffffffff;
    if ((int)uVar3 < 1) {
      uVar5 = uVar4;
    }
    for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      amrex::MLEBABecLap::setBCoeffs
                ((this->m_eb_abeclap)._M_t.
                 super___uniq_ptr_impl<amrex::MLEBABecLap,_std::default_delete<amrex::MLEBABecLap>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::MLEBABecLap_*,_std::default_delete<amrex::MLEBABecLap>_>
                 .super__Head_base<0UL,_amrex::MLEBABecLap_*,_false>._M_head_impl,(int)uVar3,
                 (Array<const_MultiFab_*,_3> *)
                 ((long)((a_beta->
                         super_vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
                         ).
                         super__Vector_base<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems + uVar4),
                 this->m_beta_loc);
      uVar4 = uVar4 + 0x18;
    }
  }
  else {
    uVar5 = uVar3 & 0xffffffff;
    if ((int)uVar3 < 1) {
      uVar5 = uVar4;
    }
    for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      amrex::MLABecLaplacian::setBCoeffs
                ((this->m_abeclap)._M_t.
                 super___uniq_ptr_impl<amrex::MLABecLaplacian,_std::default_delete<amrex::MLABecLaplacian>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::MLABecLaplacian_*,_std::default_delete<amrex::MLABecLaplacian>_>
                 .super__Head_base<0UL,_amrex::MLABecLaplacian_*,_false>._M_head_impl,(int)uVar3,
                 (Array<const_MultiFab_*,_3> *)
                 ((long)((a_beta->
                         super_vector<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
                         ).
                         super__Vector_base<std::array<const_amrex::MultiFab_*,_3UL>,_std::allocator<std::array<const_amrex::MultiFab_*,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems + uVar4));
      uVar4 = uVar4 + 0x18;
    }
  }
  return;
}

Assistant:

void MacProjector::updateBeta (
    const Vector<Array<MultiFab const*, AMREX_SPACEDIM>>& a_beta)
{
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(
        m_linop != nullptr,
        "MacProjector::updateBeta: initProjector must be called before calling this method");

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(
        m_poisson == nullptr,
        "MacProjector::updateBeta: should not be called for constant beta");

    const int nlevs = a_beta.size();
#ifdef AMREX_USE_EB
    const bool has_eb = a_beta[0][0]->hasEBFabFactory();
    if (has_eb) {
        for (int ilev=0; ilev < nlevs; ++ilev)
            m_eb_abeclap->setBCoeffs(ilev, a_beta[ilev], m_beta_loc);
    } else
#endif
    {
        for (int ilev=0; ilev < nlevs; ++ilev)
            m_abeclap->setBCoeffs(ilev, a_beta[ilev]);
    }
}